

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QString> * __thiscall
QHash<QString,_QList<QString>_>::operator[](QHash<QString,_QList<QString>_> *this,QString *key)

{
  QList<QString> *pQVar1;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QHash<QString,_QList<QString>_> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x1a2723);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }